

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

CURLcode create_conn(Curl_easy *data,connectdata **in_connect,_Bool *async)

{
  urlpieces *part;
  char **ppcVar1;
  ssl_primary_config *dest;
  ssl_primary_config *dest_00;
  curl_proxytype cVar2;
  ssl_connection_state sVar3;
  curl_slist *pcVar4;
  conncache *pcVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  size_t sVar8;
  void *pvVar9;
  bool bVar10;
  uint uVar11;
  hostname *phVar12;
  undefined8 __src;
  char cVar13;
  unsigned_short uVar14;
  CURLUcode CVar15;
  int iVar16;
  CURLcode CVar17;
  CURLcode CVar18;
  uint uVar19;
  curlntlm cVar20;
  size_t sVar21;
  size_t sVar22;
  connectdata *conn;
  ssl_backend_data *psVar23;
  char *pcVar24;
  CURLU *u;
  Curl_handler *pCVar25;
  byte *pbVar26;
  ulong uVar27;
  size_t sVar28;
  char *pcVar29;
  char **passwordp;
  long lVar30;
  timediff_t tVar31;
  connectbundle *pcVar32;
  curl_llist_element *pcVar33;
  size_t sVar34;
  connectdata *pcVar35;
  undefined8 *puVar36;
  Curl_addrinfo *pCVar37;
  _Bool _Var38;
  ulong uVar39;
  ulong uVar40;
  connectdata *pcVar41;
  size_t sVar42;
  byte *pbVar43;
  char *pcVar44;
  Curl_easy *pCVar45;
  byte *pbVar46;
  byte *__s;
  bool bVar47;
  byte bVar48;
  byte bVar49;
  bool bVar50;
  curltime cVar51;
  curltime newer;
  curltime older;
  connectdata *local_318;
  char *local_310;
  CURLcode local_304;
  char *local_300;
  curl_llist_element *local_2f8;
  char *local_2e0;
  ulong local_2b8;
  CURLcode local_2a4;
  ulong local_2a0;
  char proxyuser [256];
  _Bool local_138 [255];
  undefined1 local_39;
  
  sVar21 = Curl_multi_max_host_connections(data->multi);
  sVar22 = Curl_multi_max_total_connections(data->multi);
  *async = false;
  *in_connect = (connectdata *)0x0;
  if ((data->change).url == (char *)0x0) {
    return CURLE_URL_MALFORMAT;
  }
  lVar30 = 1;
  conn = (connectdata *)(*Curl_ccalloc)(1,0x780);
  if (conn == (connectdata *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  sVar34 = Curl_ssl->sizeof_ssl_backend_data;
  psVar23 = (ssl_backend_data *)(*Curl_ccalloc)(4,sVar34);
  if (psVar23 == (ssl_backend_data *)0x0) {
    (*Curl_cfree)(conn);
    return CURLE_OUT_OF_MEMORY;
  }
  conn->ssl_extra = psVar23;
  conn->ssl[0].backend = psVar23;
  conn->ssl[1].backend = (ssl_backend_data *)((psVar23->tap_state).master_key + (sVar34 - 0x1c));
  conn->proxy_ssl[0].backend =
       (ssl_backend_data *)((psVar23->tap_state).master_key + sVar34 * 2 + -0x1c);
  conn->proxy_ssl[1].backend =
       (ssl_backend_data *)((psVar23->tap_state).master_key + sVar34 * 3 + -0x1c);
  conn->handler = &Curl_handler_dummy;
  conn->connection_id = -1;
  conn->port = -1;
  conn->remote_port = -1;
  conn->sock[0] = -1;
  conn->sock[1] = -1;
  conn->tempsock[0] = -1;
  conn->tempsock[1] = -1;
  Curl_conncontrol(conn,1);
  cVar51 = Curl_now();
  (conn->created).tv_sec = cVar51.tv_sec;
  (conn->created).tv_usec = cVar51.tv_usec;
  cVar51 = Curl_now();
  (conn->keepalive).tv_sec = cVar51.tv_sec;
  (conn->keepalive).tv_usec = cVar51.tv_usec;
  conn->upkeep_interval_ms = (data->set).upkeep_interval_ms;
  conn->data = data;
  cVar2 = (data->set).proxytype;
  (conn->http_proxy).proxytype = cVar2;
  (conn->socks_proxy).proxytype = CURLPROXY_SOCKS4;
  pcVar24 = (data->set).str[0x15];
  if (pcVar24 == (char *)0x0) {
    (conn->bits).proxy = false;
    bVar47 = false;
    _Var38 = false;
  }
  else {
    bVar47 = *pcVar24 != '\0';
    (conn->bits).proxy = bVar47;
    _Var38 = cVar2 < (CURLPROXY_HTTPS|CURLPROXY_HTTP_1_0) && bVar47;
  }
  (conn->bits).httpproxy = _Var38;
  (conn->bits).socksproxy = (_Bool)((_Var38 ^ 1U) & bVar47);
  pcVar24 = (data->set).str[0x16];
  if ((pcVar24 != (char *)0x0) && (*pcVar24 != '\0')) {
    (conn->bits).proxy = true;
    (conn->bits).socksproxy = true;
  }
  (conn->bits).proxy_user_passwd = (data->set).str[0x2f] != (char *)0x0;
  (conn->bits).tunnel_proxy = (data->set).tunnel_thru_httpproxy;
  (conn->bits).user_passwd = (data->set).str[0x2c] != (char *)0x0;
  (conn->bits).ftp_use_epsv = (data->set).ftp_use_epsv;
  (conn->bits).ftp_use_eprt = (data->set).ftp_use_eprt;
  (conn->ssl_config).verifystatus = (data->set).ssl.primary.verifystatus;
  (conn->ssl_config).verifypeer = (data->set).ssl.primary.verifypeer;
  (conn->ssl_config).verifyhost = (data->set).ssl.primary.verifyhost;
  (conn->proxy_ssl_config).verifystatus = (data->set).proxy_ssl.primary.verifystatus;
  (conn->proxy_ssl_config).verifypeer = (data->set).proxy_ssl.primary.verifypeer;
  (conn->proxy_ssl_config).verifyhost = (data->set).proxy_ssl.primary.verifyhost;
  conn->ip_version = (data->set).ipver;
  _Var38 = Curl_pipeline_wanted(data->multi,1);
  if ((_Var38) && (conn->master_buffer == (char *)0x0)) {
    pcVar24 = (char *)(*Curl_ccalloc)(0x4000,1);
    conn->master_buffer = pcVar24;
    if (pcVar24 == (char *)0x0) goto LAB_0011a493;
  }
  Curl_llist_init(&conn->send_pipe,llist_dtor);
  Curl_llist_init(&conn->recv_pipe,llist_dtor);
  pcVar24 = (data->set).str[8];
  if (pcVar24 != (char *)0x0) {
    pcVar24 = (*Curl_cstrdup)(pcVar24);
    conn->localdev = pcVar24;
    if (pcVar24 == (char *)0x0) {
LAB_0011a493:
      Curl_llist_destroy(&conn->send_pipe,(void *)0x0);
      Curl_llist_destroy(&conn->recv_pipe,(void *)0x0);
      (*Curl_cfree)(conn->master_buffer);
      (*Curl_cfree)(conn->localdev);
      (*Curl_cfree)(conn->ssl_extra);
      (*Curl_cfree)(conn);
      return CURLE_OUT_OF_MEMORY;
    }
  }
  conn->localportrange = (data->set).localportrange;
  conn->localport = (data->set).localport;
  pvVar9 = (data->set).closesocket_client;
  conn->fclosesocket = (data->set).fclosesocket;
  conn->closesocket_client = pvVar9;
  *in_connect = conn;
  Curl_up_free(data);
  u = (data->set).uh;
  if (u == (CURLU *)0x0) {
    u = curl_url();
    (data->state).uh = u;
    if (u == (CURLU *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  if (((data->set).str[7] != (char *)0x0) &&
     (_Var38 = Curl_is_absolute_url((data->change).url,(char *)0x0,8), !_Var38)) {
    if ((data->change).url_alloc == true) {
      (*Curl_cfree)((data->change).url);
    }
    pcVar24 = curl_maprintf("%s://%s",(data->set).str[7],(data->change).url);
    if (pcVar24 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    (data->change).url = pcVar24;
    (data->change).url_alloc = true;
  }
  if ((data->set).uh == (CURLU *)0x0) {
    CVar15 = curl_url_set(u,CURLUPART_URL,(data->change).url,
                          (uint)(data->set).path_as_is * 0x10 +
                          (uint)(data->set).disallow_username_in_url * 0x20 + 0x208);
    switch(CVar15) {
    case CURLUE_OK:
      break;
    default:
      return CURLE_URL_MALFORMAT;
    case CURLUE_UNSUPPORTED_SCHEME:
      goto switchD_0011a3ad_caseD_5;
    case CURLUE_OUT_OF_MEMORY:
      goto switchD_0011a3ad_caseD_7;
    case CURLUE_USER_NOT_ALLOWED:
      goto switchD_0011a3ad_caseD_8;
    }
  }
  part = &(data->state).up;
  CVar15 = curl_url_get(u,CURLUPART_SCHEME,&part->scheme,0);
  switch(CVar15) {
  case CURLUE_OK:
    pcVar24 = part->scheme;
    pCVar25 = Curl_builtin_scheme(pcVar24);
    if (((pCVar25 == (Curl_handler *)0x0) ||
        (((uint)(data->set).allowed_protocols & pCVar25->protocol) == 0)) ||
       (((data->state).this_is_a_follow == true &&
        (((uint)(data->set).redir_protocols & pCVar25->protocol) == 0)))) {
      Curl_failf(data,"Protocol \"%s\" not supported or disabled in libcurl",pcVar24);
      return CURLE_UNSUPPORTED_PROTOCOL;
    }
    conn->given = pCVar25;
    conn->handler = pCVar25;
    ppcVar1 = &(data->state).up.user;
    CVar15 = curl_url_get(u,CURLUPART_USER,ppcVar1,0x40);
    switch(CVar15) {
    case CURLUE_OK:
      pcVar24 = (*Curl_cstrdup)(*ppcVar1);
      conn->user = pcVar24;
      if (pcVar24 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      (conn->bits).user_passwd = true;
      break;
    default:
      return CURLE_URL_MALFORMAT;
    case CURLUE_UNSUPPORTED_SCHEME:
      goto switchD_0011a3ad_caseD_5;
    case CURLUE_OUT_OF_MEMORY:
      return CURLE_OUT_OF_MEMORY;
    case CURLUE_USER_NOT_ALLOWED:
      goto switchD_0011a3ad_caseD_8;
    case CURLUE_NO_USER:
      break;
    }
    ppcVar1 = &(data->state).up.password;
    CVar15 = curl_url_get(u,CURLUPART_PASSWORD,ppcVar1,0x40);
    switch(CVar15) {
    case CURLUE_UNSUPPORTED_SCHEME:
      goto switchD_0011a3ad_caseD_5;
    case CURLUE_URLDECODE:
    case CURLUE_UNKNOWN_PART:
    case CURLUE_NO_SCHEME:
    case CURLUE_NO_USER:
      goto switchD_0011a491_caseD_6;
    case CURLUE_OUT_OF_MEMORY:
      return CURLE_OUT_OF_MEMORY;
    case CURLUE_USER_NOT_ALLOWED:
      goto switchD_0011a3ad_caseD_8;
    case CURLUE_NO_PASSWORD:
      break;
    default:
      if (CVar15 != CURLUE_OK) {
        return CURLE_URL_MALFORMAT;
      }
      pcVar24 = (*Curl_cstrdup)(*ppcVar1);
      conn->passwd = pcVar24;
      if (pcVar24 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      (conn->bits).user_passwd = true;
    }
    ppcVar1 = &(data->state).up.options;
    CVar15 = curl_url_get(u,CURLUPART_OPTIONS,ppcVar1,0x40);
    switch(CVar15) {
    case CURLUE_UNSUPPORTED_SCHEME:
      goto switchD_0011a3ad_caseD_5;
    case CURLUE_URLDECODE:
    case CURLUE_UNKNOWN_PART:
    case CURLUE_NO_SCHEME:
    case CURLUE_NO_USER:
    case CURLUE_NO_PASSWORD:
switchD_0011a491_caseD_6:
      return CURLE_URL_MALFORMAT;
    case CURLUE_OUT_OF_MEMORY:
      return CURLE_OUT_OF_MEMORY;
    case CURLUE_USER_NOT_ALLOWED:
      goto switchD_0011a3ad_caseD_8;
    default:
      if (CVar15 != CURLUE_OK) {
        return CURLE_URL_MALFORMAT;
      }
      pcVar24 = (*Curl_cstrdup)(*ppcVar1);
      conn->options = pcVar24;
      if (pcVar24 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    case CURLUE_NO_OPTIONS:
      CVar15 = curl_url_get(u,CURLUPART_HOST,&(data->state).up.hostname,0);
      if ((CVar15 != CURLUE_OK) && (iVar16 = Curl_strcasecompare("file",part->scheme), iVar16 == 0))
      {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    CVar15 = curl_url_get(u,CURLUPART_PATH,&(data->state).up.path,0);
    switch(CVar15) {
    case CURLUE_OK:
      break;
    default:
      goto switchD_0011a63f_caseD_1;
    case CURLUE_UNSUPPORTED_SCHEME:
      goto switchD_0011a3ad_caseD_5;
    case CURLUE_OUT_OF_MEMORY:
      return CURLE_OUT_OF_MEMORY;
    case CURLUE_USER_NOT_ALLOWED:
      goto switchD_0011a3ad_caseD_8;
    }
  default:
    return CURLE_URL_MALFORMAT;
  case CURLUE_UNSUPPORTED_SCHEME:
    goto switchD_0011a3ad_caseD_5;
  case CURLUE_OUT_OF_MEMORY:
    goto switchD_0011a3ad_caseD_7;
  case CURLUE_USER_NOT_ALLOWED:
    goto switchD_0011a3ad_caseD_8;
  }
  ppcVar1 = &(data->state).up.port;
  local_2a4 = CURLE_COULDNT_RESOLVE_HOST;
  CVar15 = curl_url_get(u,CURLUPART_PORT,ppcVar1,1);
  if (CVar15 == CURLUE_OK) {
    uVar27 = strtoul(*ppcVar1,(char **)0x0,10);
    uVar14 = curlx_ultous(uVar27);
    conn->remote_port = (uint)uVar14;
  }
  else {
    iVar16 = Curl_strcasecompare("file",part->scheme);
    if (iVar16 == 0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  curl_url_get(u,CURLUPART_QUERY,&(data->state).up.query,0);
  pcVar24 = (data->state).up.hostname;
  if (pcVar24 == (char *)0x0) {
    pcVar24 = "";
  }
  if (*pcVar24 == '[') {
    pcVar24 = pcVar24 + 1;
    pbVar26 = (byte *)strchr(pcVar24,0x25);
    (conn->bits).ipv6_ip = true;
    if (pbVar26 != (byte *)0x0) {
      iVar16 = *pbVar26 - 0x25;
      if ((iVar16 == 0) && (iVar16 = pbVar26[1] - 0x32, iVar16 == 0)) {
        iVar16 = 0x35 - (uint)pbVar26[2];
      }
      else {
        iVar16 = -iVar16;
      }
      if (iVar16 == 0) {
        lVar30 = 3;
      }
      else {
        Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.\n");
      }
      uVar27 = strtoul((char *)(pbVar26 + lVar30),(char **)proxyuser,10);
      __src = proxyuser._0_8_;
      if (*(char *)proxyuser._0_8_ == ']') {
        sVar28 = strlen((char *)proxyuser._0_8_);
        memmove(pbVar26,(void *)__src,sVar28 + 1);
        conn->scope_id = (uint)uVar27;
      }
      else {
        Curl_infof(data,"Invalid IPv6 address format\n");
      }
    }
    pcVar29 = strchr(pcVar24,0x5d);
    if (pcVar29 != (char *)0x0) {
      *pcVar29 = '\0';
    }
  }
  pcVar24 = (*Curl_cstrdup)(pcVar24);
  (conn->host).rawalloc = pcVar24;
  if (pcVar24 == (char *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  (conn->host).name = pcVar24;
  uVar19 = (data->set).scope_id;
  if (uVar19 != 0) {
    conn->scope_id = uVar19;
  }
  pcVar24 = (data->set).str[0x39];
  if (pcVar24 != (char *)0x0) {
    pcVar24 = (*Curl_cstrdup)(pcVar24);
    conn->oauth_bearer = pcVar24;
    if (pcVar24 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  pcVar24 = (data->set).str[0x3a];
  if (pcVar24 != (char *)0x0) {
    pcVar24 = (*Curl_cstrdup)(pcVar24);
    conn->unix_domain_socket = pcVar24;
    if (pcVar24 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    conn->abstract_unix_socket = (data->set).abstract_unix_socket;
  }
  pCVar45 = conn->data;
  if ((conn->bits).proxy_user_passwd == true) {
    memset(proxyuser,0,0x100);
    memset(local_138,0,0x100);
    pcVar24 = (pCVar45->set).str[0x2f];
    if (pcVar24 != (char *)0x0) {
      strncpy(proxyuser,pcVar24,0x100);
      proxyuser[0xff] = '\0';
    }
    pcVar24 = (pCVar45->set).str[0x30];
    if (pcVar24 != (char *)0x0) {
      strncpy(local_138,pcVar24,0x100);
      local_39 = 0;
    }
    CVar17 = Curl_urldecode(pCVar45,proxyuser,0,&(conn->http_proxy).user,(size_t *)0x0,false);
    if (CVar17 != CURLE_OK) {
LAB_0011a8f2:
      local_310 = (char *)0x0;
      goto LAB_0011af0d;
    }
    local_310 = (char *)0x0;
    CVar17 = Curl_urldecode(pCVar45,local_138,0,&(conn->http_proxy).passwd,(size_t *)0x0,false);
    pcVar24 = (char *)0x0;
    if (CVar17 == CURLE_OK) goto LAB_0011a93f;
  }
  else {
LAB_0011a93f:
    pcVar24 = (pCVar45->set).str[0x15];
    if (pcVar24 == (char *)0x0) {
      pcVar24 = (char *)0x0;
LAB_0011a988:
      pcVar29 = (pCVar45->set).str[0x16];
      if (pcVar29 == (char *)0x0) {
        local_310 = (char *)0x0;
      }
      else {
        local_310 = (*Curl_cstrdup)(pcVar29);
        if (local_310 == (char *)0x0) {
          local_310 = (char *)0x0;
          Curl_failf(pCVar45,"memory shortage");
          CVar17 = CURLE_OUT_OF_MEMORY;
          goto LAB_0011af10;
        }
      }
      if ((pCVar45->set).str[0x31] == (char *)0x0) {
        pcVar29 = "no_proxy";
        local_300 = curl_getenv("no_proxy");
        if (local_300 == (char *)0x0) {
          pcVar29 = "NO_PROXY";
          local_300 = curl_getenv("NO_PROXY");
          if (local_300 == (char *)0x0) goto LAB_0011a9e8;
        }
        Curl_infof(conn->data,"Uses proxy env variable %s == \'%s\'\n",pcVar29,local_300);
      }
      else {
LAB_0011a9e8:
        local_300 = (char *)0x0;
      }
      pcVar29 = (pCVar45->set).str[0x31];
      if (pcVar29 == (char *)0x0) {
        pcVar29 = local_300;
      }
      if ((pcVar29 == (char *)0x0) || (*pcVar29 == '\0')) {
LAB_0011abfb:
        if (pcVar24 == (char *)0x0 && local_310 == (char *)0x0) {
          pcVar24 = conn->handler->scheme;
          for (lVar30 = 0; cVar13 = pcVar24[lVar30], cVar13 != '\0'; lVar30 = lVar30 + 1) {
            iVar16 = tolower((int)cVar13);
            proxyuser[lVar30] = (char)iVar16;
          }
          builtin_strncpy(proxyuser + lVar30,"_proxy",7);
          pcVar29 = proxyuser;
          pcVar24 = curl_getenv(pcVar29);
          if (pcVar24 == (char *)0x0) {
            pcVar29 = proxyuser;
            iVar16 = Curl_strcasecompare("http_proxy",pcVar29);
            if (iVar16 == 0) {
              Curl_strntoupper(pcVar29,pcVar29,0x80);
              pcVar24 = curl_getenv(pcVar29);
              if (pcVar24 != (char *)0x0) goto LAB_0011acc3;
            }
            pcVar29 = "all_proxy";
            pcVar24 = curl_getenv("all_proxy");
            if (pcVar24 != (char *)0x0) goto LAB_0011acc3;
            pcVar29 = "ALL_PROXY";
            pcVar24 = curl_getenv("ALL_PROXY");
            if (pcVar24 != (char *)0x0) goto LAB_0011acc3;
            pcVar24 = (char *)0x0;
          }
          else {
LAB_0011acc3:
            Curl_infof(conn->data,"Uses proxy env variable %s == \'%s\'\n",pcVar29,pcVar24);
          }
          local_310 = (char *)0x0;
        }
      }
      else {
        local_2e0 = (conn->host).name;
        iVar16 = Curl_strcasecompare("*",pcVar29);
        if (iVar16 == 0) {
          sVar28 = strlen(pcVar29);
          if (*local_2e0 == '[') {
            pcVar44 = strchr(local_2e0,0x5d);
            if (pcVar44 == (char *)0x0) goto LAB_0011abfb;
            local_2e0 = local_2e0 + 1;
            local_2b8 = (long)pcVar44 - (long)local_2e0;
          }
          else {
            local_2b8 = strlen(local_2e0);
          }
          sVar42 = 0;
          while (sVar42 < sVar28) {
            while( true ) {
              if (sVar28 == sVar42) goto LAB_0011abfb;
              bVar48 = pcVar29[sVar42];
              local_2f8 = (curl_llist_element *)sVar42;
              if ((0x2c < (ulong)bVar48) || ((0x100100000001U >> ((ulong)bVar48 & 0x3f) & 1) == 0))
              break;
              sVar42 = sVar42 + 1;
            }
            while ((pcVar33 = (curl_llist_element *)sVar28,
                   (curl_llist_element *)sVar28 != local_2f8 &&
                   ((0x2c < (ulong)(byte)pcVar29[(long)local_2f8] ||
                    (pcVar33 = local_2f8,
                    (0x100100000001U >> ((ulong)(byte)pcVar29[(long)local_2f8] & 0x3f) & 1) == 0))))
                  ) {
              local_2f8 = (curl_llist_element *)((long)local_2f8 + 1);
            }
            local_2f8 = pcVar33;
            uVar27 = (ulong)(bVar48 == 0x2e);
            sVar34 = ((long)local_2f8 - uVar27) - sVar42;
            if (sVar34 <= local_2b8) {
              iVar16 = Curl_strncasecompare
                                 (pcVar29 + sVar42 + uVar27,
                                  local_2e0 + (uVar27 - (long)local_2f8) + sVar42 + local_2b8,sVar34
                                 );
              if ((iVar16 != 0) &&
                 ((((long)local_2f8 - uVar27) - local_2b8 == sVar42 ||
                  (local_2e0[(sVar42 - 1) + (uVar27 - (long)local_2f8) + local_2b8] == '.'))))
              goto LAB_0011aa86;
            }
            sVar42 = (long)local_2f8 + 1;
          }
          goto LAB_0011abfb;
        }
LAB_0011aa86:
        (*Curl_cfree)(pcVar24);
        (*Curl_cfree)(local_310);
        local_310 = (char *)0x0;
        pcVar24 = (char *)0x0;
      }
      (*Curl_cfree)(local_300);
      if (pcVar24 == (char *)0x0) {
LAB_0011ad10:
        pcVar24 = (char *)0x0;
      }
      else if (((conn->unix_domain_socket != (char *)0x0) || (*pcVar24 == '\0')) ||
              ((conn->handler->flags & 0x10) != 0)) {
        (*Curl_cfree)(pcVar24);
        goto LAB_0011ad10;
      }
      if (local_310 == (char *)0x0) {
LAB_0011ad48:
        if (pcVar24 != (char *)0x0) {
          local_310 = (char *)0x0;
          bVar47 = false;
LAB_0011ad5d:
          CVar17 = parse_proxy(pCVar45,conn,pcVar24,(conn->http_proxy).proxytype);
          (*Curl_cfree)(pcVar24);
          if (CVar17 != CURLE_OK) goto LAB_0011af0d;
          if (bVar47) goto LAB_0011ad8a;
          goto LAB_0011adb7;
        }
LAB_0011ae5d:
        (conn->bits).proxy = false;
        (conn->bits).httpproxy = false;
        (conn->bits).socksproxy = false;
        (conn->bits).proxy_user_passwd = false;
        (conn->bits).tunnel_proxy = false;
      }
      else {
        if ((*local_310 == '\0') || ((conn->handler->flags & 0x10) != 0)) {
          (*Curl_cfree)(local_310);
          goto LAB_0011ad48;
        }
        bVar47 = true;
        if (pcVar24 != (char *)0x0) goto LAB_0011ad5d;
LAB_0011ad8a:
        CVar17 = parse_proxy(pCVar45,conn,local_310,(conn->socks_proxy).proxytype);
        (*Curl_cfree)(local_310);
        if (CVar17 != CURLE_OK) goto LAB_0011a8f2;
LAB_0011adb7:
        if ((conn->http_proxy).host.rawalloc == (char *)0x0) {
          (conn->bits).httpproxy = false;
          (conn->bits).tunnel_proxy = false;
          if ((conn->socks_proxy).host.rawalloc == (char *)0x0) {
            (conn->bits).proxy = false;
            goto LAB_0011ae5d;
          }
          if ((conn->socks_proxy).user == (char *)0x0) {
            pcVar24 = (conn->socks_proxy).passwd;
            (conn->socks_proxy).user = (conn->http_proxy).user;
            (conn->http_proxy).user = (char *)0x0;
            (*Curl_cfree)(pcVar24);
            (conn->socks_proxy).passwd = (conn->http_proxy).passwd;
            (conn->http_proxy).passwd = (char *)0x0;
            (conn->bits).socksproxy = true;
            goto LAB_0011aefa;
          }
          (conn->bits).socksproxy = true;
          (conn->bits).proxy = true;
        }
        else {
          if ((conn->handler->protocol & 3) == 0) {
            if (((conn->handler->flags & 0x800) == 0) || ((conn->bits).tunnel_proxy != false)) {
              (conn->bits).tunnel_proxy = true;
            }
            else {
              conn->handler = &Curl_handler_http;
            }
          }
          (conn->bits).httpproxy = true;
          (conn->bits).socksproxy = (conn->socks_proxy).host.rawalloc != (char *)0x0;
LAB_0011aefa:
          (conn->bits).proxy = true;
        }
      }
      local_310 = (char *)0x0;
      CVar17 = CURLE_OK;
    }
    else {
      pcVar24 = (*Curl_cstrdup)(pcVar24);
      if (pcVar24 != (char *)0x0) goto LAB_0011a988;
      local_310 = (char *)0x0;
      Curl_failf(pCVar45,"memory shortage");
      CVar17 = CURLE_OUT_OF_MEMORY;
    }
LAB_0011af0d:
    pcVar24 = (char *)0x0;
  }
LAB_0011af10:
  (*Curl_cfree)(local_310);
  (*Curl_cfree)(pcVar24);
  if (CVar17 != CURLE_OK) {
    return CVar17;
  }
  if (((conn->given->flags & 1) != 0) && ((conn->bits).httpproxy == true)) {
    (conn->bits).tunnel_proxy = true;
  }
  lVar30 = (data->set).use_port;
  if ((lVar30 != 0) && ((data->state).allow_port == true)) {
    conn->remote_port = (uint)lVar30 & 0xffff;
    curl_msnprintf(proxyuser,0x10,"%d");
    CVar15 = curl_url_set((data->state).uh,CURLUPART_PORT,proxyuser,0);
    if (CVar15 != CURLUE_OK) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  ppcVar1 = &conn->user;
  passwordp = &conn->passwd;
  if (((data->set).use_netrc == CURL_NETRC_REQUIRED) && ((conn->bits).user_passwd == true)) {
    bVar48 = *ppcVar1 != (char *)0x0;
    if ((bool)bVar48) {
      (*Curl_cfree)(*ppcVar1);
      *ppcVar1 = (char *)0x0;
    }
    bVar49 = *passwordp != (char *)0x0;
    if ((bool)bVar49) {
      (*Curl_cfree)(*passwordp);
      *passwordp = (char *)0x0;
    }
    (conn->bits).user_passwd = false;
  }
  else {
    bVar48 = false;
    bVar49 = false;
  }
  if ((data->set).str[0x2c] != (char *)0x0) {
    (*Curl_cfree)(*ppcVar1);
    pcVar24 = (*Curl_cstrdup)((data->set).str[0x2c]);
    *ppcVar1 = pcVar24;
    if (pcVar24 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    (conn->bits).user_passwd = true;
    bVar48 = true;
  }
  if ((data->set).str[0x2d] != (char *)0x0) {
    (*Curl_cfree)(*passwordp);
    pcVar24 = (*Curl_cstrdup)((data->set).str[0x2d]);
    *passwordp = pcVar24;
    if (pcVar24 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    (conn->bits).user_passwd = true;
    bVar49 = true;
  }
  if ((data->set).str[0x2e] != (char *)0x0) {
    (*Curl_cfree)(conn->options);
    pcVar24 = (*Curl_cstrdup)((data->set).str[0x2e]);
    conn->options = pcVar24;
    if (pcVar24 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  (conn->bits).netrc = false;
  if (((data->set).use_netrc != CURL_NETRC_IGNORED) &&
     ((((*ppcVar1 == (char *)0x0 || (**ppcVar1 == '\0')) || (*passwordp == (char *)0x0)) ||
      (**passwordp == '\0')))) {
    proxyuser._0_8_ = proxyuser._0_8_ & 0xffffffffffffff00;
    local_138[0] = false;
    iVar16 = Curl_parsenetrc((conn->host).name,ppcVar1,passwordp,(_Bool *)proxyuser,local_138,
                             (data->set).str[0x14]);
    if (iVar16 < 1) {
      if (iVar16 < 0) {
        return CURLE_OUT_OF_MEMORY;
      }
      (conn->bits).netrc = true;
      (conn->bits).user_passwd = true;
      bVar48 = bVar48 | proxyuser[0];
      bVar49 = bVar49 | local_138[0];
    }
    else {
      Curl_infof(data,"Couldn\'t find host %s in the .netrc file; using defaults\n",
                 (conn->host).name);
    }
  }
  if (bVar48 != 0) {
    CVar15 = curl_url_set((data->state).uh,CURLUPART_USER,*ppcVar1,0);
    switch(CVar15) {
    case CURLUE_OK:
      break;
    case CURLUE_BAD_HANDLE:
    case CURLUE_BAD_PARTPOINTER:
    case CURLUE_MALFORMED_INPUT:
    case CURLUE_BAD_PORT_NUMBER:
    case CURLUE_URLDECODE:
      return CURLE_URL_MALFORMAT;
    case CURLUE_UNSUPPORTED_SCHEME:
switchD_0011a3ad_caseD_5:
      return CURLE_UNSUPPORTED_PROTOCOL;
    case CURLUE_OUT_OF_MEMORY:
      goto switchD_0011a3ad_caseD_7;
    case CURLUE_USER_NOT_ALLOWED:
      goto switchD_0011a3ad_caseD_8;
    default:
switchD_0011a63f_caseD_1:
      return CURLE_URL_MALFORMAT;
    }
  }
  if (bVar49 != 0) {
    CVar17 = CURLE_URL_MALFORMAT;
    CVar15 = curl_url_set((data->state).uh,CURLUPART_PASSWORD,*passwordp,0);
    switch(CVar15) {
    case CURLUE_OK:
      break;
    default:
      goto switchD_0011b217_caseD_1;
    case CURLUE_UNSUPPORTED_SCHEME:
      return CURLE_UNSUPPORTED_PROTOCOL;
    case CURLUE_OUT_OF_MEMORY:
      goto switchD_0011a3ad_caseD_7;
    case CURLUE_USER_NOT_ALLOWED:
switchD_0011a3ad_caseD_8:
      return CURLE_LOGIN_DENIED;
    }
  }
  if (((conn->handler->flags & 0x20) == 0) || ((conn->bits).user_passwd == true)) {
    pcVar29 = "";
    pcVar24 = "";
  }
  else {
    pcVar29 = "ftp@example.com";
    pcVar24 = "anonymous";
  }
  if (*ppcVar1 == (char *)0x0) {
    pcVar24 = (*Curl_cstrdup)(pcVar24);
    *ppcVar1 = pcVar24;
    if (pcVar24 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  if (*passwordp == (char *)0x0) {
    pcVar24 = (*Curl_cstrdup)(pcVar29);
    *passwordp = pcVar24;
    if (pcVar24 == (char *)0x0 && *ppcVar1 != (char *)0x0) {
      pcVar24 = (*Curl_cstrdup)("");
      *passwordp = pcVar24;
      return CURLE_OUT_OF_MEMORY;
    }
    if (pcVar24 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  local_318 = (connectdata *)&(data->set).connect_to;
  pcVar24 = (char *)0x0;
  uVar27 = 0xffffffff;
LAB_0011b2b9:
  if ((((int)uVar27 == -1) && (pcVar24 == (char *)0x0)) &&
     (pcVar4 = *(curl_slist **)local_318, pcVar4 != (curl_slist *)0x0)) {
    pcVar24 = pcVar4->data;
    if (*pcVar24 == ':') {
LAB_0011b37a:
      if (pcVar24[1] != ':') {
        pcVar29 = strchr(pcVar24 + 1,0x3a);
        if (pcVar29 != (char *)0x0) {
          proxyuser[0] = '\0';
          proxyuser[1] = '\0';
          proxyuser[2] = '\0';
          proxyuser[3] = '\0';
          proxyuser[4] = '\0';
          proxyuser[5] = '\0';
          proxyuser[6] = '\0';
          proxyuser[7] = '\0';
          lVar30 = strtol(pcVar24 + 1,(char **)proxyuser,10);
          if (((char *)proxyuser._0_8_ == pcVar29) && (lVar30 == conn->remote_port)) {
            pcVar24 = pcVar29 + 1;
            goto LAB_0011b385;
          }
        }
        goto LAB_0011b44d;
      }
      pcVar24 = pcVar24 + 2;
LAB_0011b385:
      if (*pcVar24 == '\0') goto LAB_0011b44d;
      pbVar26 = (byte *)(*Curl_cstrdup)(pcVar24);
      if (pbVar26 == (byte *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      pbVar46 = pbVar26;
      __s = pbVar26;
      if (*pbVar26 == 0x5b) {
        pbVar43 = pbVar26 + 2;
        pbVar46 = pbVar26 + 1;
        for (__s = pbVar46; *__s != 0; __s = __s + 1) {
          iVar16 = Curl_isxdigit((uint)*__s);
          if (((iVar16 == 0) && (bVar48 = *__s, bVar48 != 0x2e)) && (bVar48 != 0x3a)) {
            if (bVar48 != 0x25) goto LAB_0011b51f;
            if (__s[1] - 0x32 == 0) {
              iVar16 = 0x35 - (uint)__s[2];
            }
            else {
              iVar16 = -(__s[1] - 0x32);
            }
            if (iVar16 != 0) {
              Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.\n");
            }
            goto LAB_0011b4dc;
          }
          pbVar43 = pbVar43 + 1;
        }
        goto LAB_0011b52c;
      }
      goto LAB_0011b53d;
    }
    bVar47 = (conn->bits).ipv6_ip != false;
    pcVar29 = "";
    pcVar44 = "";
    if (bVar47) {
      pcVar44 = "[";
    }
    if (bVar47) {
      pcVar29 = "]";
    }
    pcVar29 = curl_maprintf("%s%s%s",pcVar44,(conn->host).name,pcVar29);
    if (pcVar29 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    sVar28 = strlen(pcVar29);
    iVar16 = Curl_strncasecompare(pcVar24,pcVar29,sVar28);
    (*Curl_cfree)(pcVar29);
    if ((iVar16 != 0) && (pcVar24[sVar28] == ':')) {
      pcVar24 = pcVar24 + sVar28;
      goto LAB_0011b37a;
    }
LAB_0011b44d:
    pcVar24 = (char *)0x0;
    uVar27 = 0xffffffff;
    goto LAB_0011b456;
  }
  CVar17 = idnconvert_hostname(conn,&conn->host);
  if (CVar17 != CURLE_OK) {
    return CVar17;
  }
  if (((conn->bits).conn_to_host == true) &&
     (CVar17 = idnconvert_hostname(conn,&conn->conn_to_host), CVar17 != CURLE_OK)) {
    return CVar17;
  }
  if (((conn->bits).httpproxy == true) &&
     (CVar17 = idnconvert_hostname(conn,&(conn->http_proxy).host), CVar17 != CURLE_OK)) {
    return CVar17;
  }
  if (((conn->bits).socksproxy == true) &&
     (CVar17 = idnconvert_hostname(conn,&(conn->socks_proxy).host), CVar17 != CURLE_OK)) {
    return CVar17;
  }
  if (((conn->bits).conn_to_host == true) &&
     (iVar16 = Curl_strcasecompare((conn->conn_to_host).name,(conn->host).name), iVar16 != 0)) {
    (conn->bits).conn_to_host = false;
  }
  cVar13 = (conn->bits).conn_to_port;
  if (((_Bool)cVar13 == true) && (conn->conn_to_port == conn->remote_port)) {
    (conn->bits).conn_to_port = false;
    cVar13 = '\0';
  }
  if ((((conn->bits).conn_to_host != false) || (cVar13 != '\0')) && ((conn->bits).httpproxy == true)
     ) {
    (conn->bits).tunnel_proxy = true;
  }
  conn->socktype = 1;
  pCVar25 = conn->handler;
  if (pCVar25->setup_connection != (_func_CURLcode_connectdata_ptr *)0x0) {
    CVar17 = (*pCVar25->setup_connection)(conn);
    if (CVar17 != CURLE_OK) {
      return CVar17;
    }
    pCVar25 = conn->handler;
  }
  if (conn->port < 0) {
    conn->port = pCVar25->defport;
  }
  conn->recv[0] = Curl_recv_plain;
  conn->send[0] = Curl_send_plain;
  conn->recv[1] = Curl_recv_plain;
  conn->send[1] = Curl_send_plain;
  (conn->bits).tcp_fastopen = (data->set).tcp_fastopen;
  if ((pCVar25->flags & 0x10) != 0) {
    Curl_persistconninfo(conn);
    CVar17 = (*conn->handler->connect_it)(conn,(_Bool *)proxyuser);
    if (CVar17 == CURLE_OK) {
      (conn->bits).tcpconnect[0] = true;
      CVar18 = Curl_conncache_add_conn((data->state).conn_cache,conn);
      if (CVar18 != CURLE_OK) {
        return CVar18;
      }
      CVar18 = setup_range(data);
      if (CVar18 != CURLE_OK) {
        (*conn->handler->done)(conn,CVar18,false);
        return CVar18;
      }
      Curl_setup_transfer(conn,-1,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
    }
    Curl_init_do(data,conn);
switchD_0011b217_caseD_1:
    return CVar17;
  }
  pcVar24 = (data->set).str[0x1b];
  (data->set).ssl.primary.CApath = (data->set).str[0x1a];
  (data->set).proxy_ssl.primary.CApath = pcVar24;
  (data->set).ssl.primary.CAfile = (data->set).str[0x1c];
  (data->set).proxy_ssl.primary.CAfile = (data->set).str[0x1d];
  pcVar24 = (data->set).str[0x25];
  (data->set).ssl.primary.random_file = pcVar24;
  (data->set).proxy_ssl.primary.random_file = pcVar24;
  pcVar24 = (data->set).str[0x24];
  (data->set).ssl.primary.egdsocket = pcVar24;
  (data->set).proxy_ssl.primary.egdsocket = pcVar24;
  (data->set).ssl.primary.cipher_list = (data->set).str[0x20];
  (data->set).proxy_ssl.primary.cipher_list = (data->set).str[0x21];
  (data->set).ssl.primary.cipher_list13 = (data->set).str[0x22];
  (data->set).proxy_ssl.primary.cipher_list13 = (data->set).str[0x23];
  (data->set).ssl.CRLfile = (data->set).str[0x27];
  (data->set).proxy_ssl.CRLfile = (data->set).str[0x28];
  (data->set).ssl.issuercert = (data->set).str[0x29];
  (data->set).proxy_ssl.issuercert = (data->set).str[0x2a];
  pcVar24 = (data->set).str[0];
  pcVar29 = (data->set).str[1];
  (data->set).ssl.cert = pcVar24;
  (data->set).proxy_ssl.cert = pcVar29;
  (data->set).ssl.cert_type = (data->set).str[2];
  (data->set).proxy_ssl.cert_type = (data->set).str[3];
  pcVar44 = (data->set).str[0xe];
  (data->set).ssl.key = (data->set).str[0xd];
  (data->set).proxy_ssl.key = pcVar44;
  (data->set).ssl.key_type = (data->set).str[0x11];
  (data->set).proxy_ssl.key_type = (data->set).str[0x12];
  (data->set).ssl.key_passwd = (data->set).str[0xf];
  (data->set).proxy_ssl.key_passwd = (data->set).str[0x10];
  (data->set).ssl.primary.clientcert = pcVar24;
  (data->set).proxy_ssl.primary.clientcert = pcVar29;
  dest = &conn->ssl_config;
  _Var38 = Curl_clone_primary_ssl_config(&(data->set).ssl.primary,dest);
  if (!_Var38) {
switchD_0011a3ad_caseD_7:
    return CURLE_OUT_OF_MEMORY;
  }
  dest_00 = &conn->proxy_ssl_config;
  _Var38 = Curl_clone_primary_ssl_config(&(data->set).proxy_ssl.primary,dest_00);
  if (!_Var38) {
    return CURLE_OUT_OF_MEMORY;
  }
  cVar51 = Curl_now();
  pcVar5 = (data->state).conn_cache;
  uVar6 = (pcVar5->last_cleanup).tv_sec;
  uVar7 = (pcVar5->last_cleanup).tv_usec;
  older.tv_usec = uVar7;
  older.tv_sec = uVar6;
  newer._12_4_ = 0;
  newer.tv_sec = SUB128(cVar51._0_12_,0);
  newer.tv_usec = SUB124(cVar51._0_12_,8);
  older._12_4_ = 0;
  tVar31 = Curl_timediff(newer,older);
  if (999 < tVar31) {
    proxyuser[8] = '\0';
    proxyuser[9] = '\0';
    proxyuser[10] = '\0';
    proxyuser[0xb] = '\0';
    proxyuser[0xc] = '\0';
    proxyuser[0xd] = '\0';
    proxyuser[0xe] = '\0';
    proxyuser[0xf] = '\0';
    proxyuser._0_8_ = data;
    while (_Var38 = Curl_conncache_foreach
                              (data,(data->state).conn_cache,proxyuser,call_extract_if_dead), _Var38
          ) {
      Curl_disconnect(data,(connectdata *)proxyuser._8_8_,true);
    }
    pcVar5 = (data->state).conn_cache;
    (pcVar5->last_cleanup).tv_sec = cVar51.tv_sec;
    (pcVar5->last_cleanup).tv_usec = cVar51.tv_usec;
  }
  if (((data->set).reuse_fresh != true) || ((data->state).this_is_a_follow == true)) {
    uVar19 = IsPipeliningPossible(data,conn);
    if (((data->state).authhost.want & 0x28) == 0) {
      bVar47 = false;
    }
    else {
      bVar47 = (conn->handler->protocol & 3) != 0;
    }
    if (((conn->bits).proxy_user_passwd == true) && (((data->state).authproxy.want & 0x28) != 0)) {
      bVar50 = (conn->handler->protocol & 3) != 0;
    }
    else {
      bVar50 = false;
    }
    if ((uVar19 & 1) != 0) {
      _Var38 = Curl_pipeline_site_blacklisted(data,conn);
      if (_Var38) {
        uVar19 = uVar19 & 2;
      }
    }
    pcVar32 = Curl_conncache_find_bundle(conn,(data->state).conn_cache);
    if (pcVar32 != (connectbundle *)0x0) {
      if (pcVar32->multiuse == 2) {
        pcVar24 = "can multiplex";
LAB_0011bbe4:
        local_2a0 = 0;
      }
      else {
        pcVar24 = "serially";
        if (data->multi == (Curl_multi *)0x0) goto LAB_0011bbe4;
        local_2a0 = data->multi->max_pipeline_length;
      }
      phVar12 = &conn->host;
      if ((conn->bits).conn_to_host != false) {
        phVar12 = &conn->conn_to_host;
      }
      pcVar29 = "can pipeline";
      if (pcVar32->multiuse != 1) {
        pcVar29 = pcVar24;
      }
      Curl_infof(data,"Found bundle for host %s: %p [%s]\n",phVar12->name,pcVar32,pcVar29);
      uVar11 = 0;
      if (uVar19 != 0) {
        iVar16 = pcVar32->multiuse;
        if (iVar16 < 1) {
          if ((iVar16 == 0) && ((data->set).pipewait != false)) {
            Curl_infof(data,"Server doesn\'t support multi-use yet, wait\n");
            Curl_conncache_unlock(data);
LAB_0011cb00:
            bVar47 = true;
            goto LAB_0011cb07;
          }
          uVar19 = 0;
          Curl_infof(data,"Server doesn\'t support multi-use (yet)\n");
          iVar16 = pcVar32->multiuse;
        }
        if (iVar16 == 1) {
          _Var38 = Curl_pipeline_wanted(data->multi,1);
          if (_Var38) {
            iVar16 = pcVar32->multiuse;
            goto LAB_0011bcbd;
          }
          pcVar24 = "Could pipeline, but not asked to!\n";
        }
        else {
LAB_0011bcbd:
          uVar11 = uVar19;
          if ((iVar16 != 2) || (_Var38 = Curl_pipeline_wanted(data->multi,2), _Var38))
          goto LAB_0011bd08;
          pcVar24 = "Could multiplex, but not asked to!\n";
        }
        Curl_infof(data,pcVar24);
        uVar11 = 0;
      }
LAB_0011bd08:
      local_2f8 = (pcVar32->conn_list).head;
      uVar27 = local_2a0;
      pcVar35 = (connectdata *)0x0;
      bVar48 = 0;
LAB_0011bd64:
      bVar49 = bVar48;
      pcVar41 = pcVar35;
      uVar39 = uVar27;
      if (local_2f8 == (curl_llist_element *)0x0) {
        if (pcVar41 != (connectdata *)0x0) {
          bVar10 = false;
          local_318 = pcVar41;
          goto LAB_0011c6d7;
        }
        Curl_conncache_unlock(data);
        if ((bVar49 == 0) || ((data->set).pipewait != true)) goto LAB_0011cb05;
        Curl_infof(data,"Found pending candidate for reuse and CURLOPT_PIPEWAIT is set\n");
        goto LAB_0011cb00;
      }
      local_318 = (connectdata *)local_2f8->ptr;
      local_2f8 = local_2f8->next;
      _Var38 = extract_if_dead(local_318,data);
      uVar27 = uVar39;
      pcVar35 = pcVar41;
      bVar48 = bVar49;
      if (_Var38) {
        Curl_disconnect(data,local_318,true);
LAB_0011bdab:
        uVar27 = uVar39;
        pcVar35 = pcVar41;
        bVar48 = bVar49;
        goto LAB_0011bd64;
      }
      uVar40 = (local_318->recv_pipe).size + (local_318->send_pipe).size;
      if (uVar11 == 0) {
        if (uVar40 == 0) {
          if (local_318->ip_addr_str[0] == '\0') {
            uVar40 = local_318->connection_id;
            pcVar24 = "Connection #%ld is still name resolving, can\'t reuse\n";
LAB_0011c10f:
            Curl_infof(data,pcVar24,uVar40);
            goto LAB_0011bdab;
          }
          iVar16 = local_318->sock[0];
          _Var38 = (local_318->bits).close;
          if (iVar16 != -1 && (_Var38 & 1U) == 0) goto LAB_0011befb;
          Curl_infof(data,"Connection #%ld isn\'t open enough, can\'t reuse\n",
                     local_318->connection_id);
          bVar48 = (_Var38 ^ 1U) & iVar16 == -1 | bVar49;
        }
        goto LAB_0011bd64;
      }
      if (((local_318->bits).protoconnstart == true) && ((local_318->bits).close != false))
      goto LAB_0011bd64;
      if ((local_318->bits).multiplex == false) {
        pcVar33 = (local_318->send_pipe).head;
        if (pcVar33 == (curl_llist_element *)0x0) {
          pcVar33 = (local_318->recv_pipe).head;
          if (pcVar33 != (curl_llist_element *)0x0) {
LAB_0011bed8:
            pCVar45 = (Curl_easy *)pcVar33->ptr;
            goto LAB_0011bedb;
          }
        }
        else {
          pCVar45 = (Curl_easy *)pcVar33->ptr;
          pcVar33 = (local_318->recv_pipe).head;
          if (pcVar33 == (curl_llist_element *)0x0) {
LAB_0011bedb:
            if (pCVar45 == (Curl_easy *)0x0) goto LAB_0011befb;
          }
          else if (pCVar45 == (Curl_easy *)0x0) goto LAB_0011bed8;
          uVar19 = IsPipeliningPossible(pCVar45,local_318);
          if ((uVar19 & 1) == 0) goto LAB_0011bd64;
        }
      }
LAB_0011befb:
      pcVar24 = local_318->unix_domain_socket;
      if (conn->unix_domain_socket == (char *)0x0) {
        if (pcVar24 != (char *)0x0) goto LAB_0011bd64;
      }
      else if (((pcVar24 == (char *)0x0) ||
               (iVar16 = strcmp(conn->unix_domain_socket,pcVar24), iVar16 != 0)) ||
              (conn->abstract_unix_socket != local_318->abstract_unix_socket)) goto LAB_0011bd64;
      pCVar25 = conn->handler;
      if (((((((local_318->handler->flags ^ pCVar25->flags) & 1) != 0) &&
            ((uVar19 = get_protocol_family(local_318->handler->protocol),
             uVar19 != pCVar25->protocol || (local_318->tls_upgraded != true)))) ||
           ((conn->bits).httpproxy != (local_318->bits).httpproxy)) ||
          ((_Var38 = (conn->bits).socksproxy, _Var38 != (local_318->bits).socksproxy ||
           ((_Var38 != false &&
            (_Var38 = proxy_info_matches(&conn->socks_proxy,&local_318->socks_proxy), !_Var38))))))
         || (((conn->bits).conn_to_host != (local_318->bits).conn_to_host ||
             ((conn->bits).conn_to_port != (local_318->bits).conn_to_port)))) goto LAB_0011bd64;
      if ((conn->bits).httpproxy == true) {
        _Var38 = proxy_info_matches(&conn->http_proxy,&local_318->http_proxy);
        if ((!_Var38) || ((conn->bits).tunnel_proxy != (local_318->bits).tunnel_proxy))
        goto LAB_0011bd64;
        if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
          if ((conn->handler->flags & 1) == 0) {
            _Var38 = Curl_ssl_config_matches(dest,&local_318->ssl_config);
            if (!_Var38) goto LAB_0011bd64;
            sVar3 = local_318->ssl[0].state;
          }
          else {
            _Var38 = Curl_ssl_config_matches(dest_00,&local_318->proxy_ssl_config);
            if (!_Var38) goto LAB_0011bd64;
            sVar3 = local_318->proxy_ssl[0].state;
          }
          if (sVar3 != ssl_connection_complete) goto LAB_0011bd64;
        }
      }
      sVar8 = -(local_318->recv_pipe).size;
      sVar34 = (local_318->send_pipe).size;
      if (((uVar11 == 0) && (sVar34 != sVar8)) ||
         ((sVar34 != sVar8 && (local_318->data->multi != conn->data->multi)))) goto LAB_0011bd64;
      pcVar24 = conn->localdev;
      if ((pcVar24 != (char *)0x0 || conn->localport != 0) &&
         (((local_318->localport != conn->localport ||
           (local_318->localportrange != conn->localportrange)) ||
          ((pcVar24 != (char *)0x0 &&
           ((local_318->localdev == (char *)0x0 ||
            (iVar16 = strcmp(local_318->localdev,pcVar24), iVar16 != 0)))))))) goto LAB_0011bd64;
      pCVar25 = conn->handler;
      uVar19 = pCVar25->flags;
      if (((-1 < (char)uVar19) &&
          ((iVar16 = strcmp(*ppcVar1,local_318->user), iVar16 != 0 ||
           (iVar16 = strcmp(*passwordp,local_318->passwd), iVar16 != 0)))) ||
         ((((uVar19 & 1) != 0 ||
           (((conn->bits).httpproxy == false || ((conn->bits).tunnel_proxy == true)))) &&
          (((iVar16 = Curl_strcasecompare(pCVar25->scheme,local_318->handler->scheme), iVar16 == 0
            && ((uVar19 = get_protocol_family(local_318->handler->protocol),
                uVar19 != conn->handler->protocol || (local_318->tls_upgraded != true)))) ||
           (((((conn->bits).conn_to_host == true &&
              (iVar16 = Curl_strcasecompare((conn->conn_to_host).name,(local_318->conn_to_host).name
                                           ), iVar16 == 0)) ||
             (((((conn->bits).conn_to_port == true &&
                (conn->conn_to_port != local_318->conn_to_port)) ||
               (iVar16 = Curl_strcasecompare((conn->host).name,(local_318->host).name), iVar16 == 0)
               ) || (conn->remote_port != local_318->remote_port)))) ||
            (((conn->handler->flags & 1) != 0 &&
             ((_Var38 = Curl_ssl_config_matches(dest,&local_318->ssl_config), !_Var38 ||
              (bVar48 = 1, local_318->ssl[0].state != ssl_connection_complete))))))))))))
      goto LAB_0011bd64;
      if (bVar47) {
        iVar16 = strcmp(*ppcVar1,local_318->user);
        bVar48 = bVar49;
        if (iVar16 != 0) goto LAB_0011bd64;
        cVar20 = strcmp(*passwordp,local_318->passwd);
      }
      else {
        cVar20 = (local_318->ntlm).state;
      }
      bVar48 = bVar49;
      if (cVar20 != NTLMSTATE_NONE) goto LAB_0011bd64;
      if (bVar50) {
        pcVar24 = (local_318->http_proxy).user;
        if ((((pcVar24 == (char *)0x0) ||
             (pcVar29 = (local_318->http_proxy).passwd, pcVar29 == (char *)0x0)) ||
            (iVar16 = strcmp((conn->http_proxy).user,pcVar24), iVar16 != 0)) ||
           (iVar16 = strcmp((conn->http_proxy).passwd,pcVar29), iVar16 != 0)) goto LAB_0011bd64;
      }
      else {
        if ((local_318->proxyntlm).state != NTLMSTATE_NONE) goto LAB_0011bd64;
        if (!bVar47) {
          bVar10 = false;
          if ((uVar11 == 0) || (bVar10 = false, uVar40 == 0)) goto LAB_0011c6d7;
          if (local_2a0 - 1 < uVar40) {
            pcVar24 = "Pipe is full, skip (%zu)\n";
            goto LAB_0011c10f;
          }
          _Var38 = Curl_pipeline_penalized(data,local_318);
          if (_Var38) {
            Curl_infof(data,"Penalized, skip\n");
            goto LAB_0011bdab;
          }
          if (local_2a0 == 0) {
            bVar10 = false;
            Curl_infof(data,"Multiplexed connection found!\n");
            goto LAB_0011c6d7;
          }
          uVar27 = uVar40;
          pcVar35 = local_318;
          if (uVar40 < uVar39) goto LAB_0011bd64;
          goto LAB_0011bdab;
        }
      }
      if (((bVar47) && ((local_318->ntlm).state != NTLMSTATE_NONE)) ||
         ((pcVar35 = local_318, bVar50 && ((local_318->proxyntlm).state != NTLMSTATE_NONE))))
      goto LAB_0011cff7;
      goto LAB_0011bd64;
    }
    Curl_conncache_unlock(data);
  }
LAB_0011cb05:
  bVar47 = false;
LAB_0011cb07:
  if ((conn->handler->flags & 0x100) != 0) {
    if ((data->set).ssl_enable_alpn == true) {
      (conn->bits).tls_enable_alpn = true;
    }
    if ((data->set).ssl_enable_npn == true) {
      (conn->bits).tls_enable_npn = true;
    }
  }
  if (bVar47) {
LAB_0011cb3e:
    Curl_infof(data,"No connections available.\n");
    conn_free(conn);
    *in_connect = (connectdata *)0x0;
    return CURLE_NO_CONNECTION_AVAILABLE;
  }
  pcVar32 = Curl_conncache_find_bundle(conn,(data->state).conn_cache);
  if ((pcVar32 == (connectbundle *)0x0 || sVar21 == 0) || (pcVar32->num_connections < sVar21)) {
    Curl_conncache_unlock(data);
  }
  else {
    pcVar35 = Curl_conncache_extract_bundle(data,pcVar32);
    Curl_conncache_unlock(data);
    if (pcVar35 == (connectdata *)0x0) {
      Curl_infof(data,"No more connections allowed to host: %zu\n",sVar21);
      goto LAB_0011cb3e;
    }
    Curl_disconnect(data,pcVar35,false);
  }
  if ((sVar22 != 0) && (sVar21 = Curl_conncache_size(data), sVar22 <= sVar21)) {
    pcVar35 = Curl_conncache_extract_oldest(data);
    if (pcVar35 == (connectdata *)0x0) {
      Curl_infof(data,"No connections available in cache\n");
      goto LAB_0011cb3e;
    }
    Curl_disconnect(data,pcVar35,false);
  }
  CVar17 = Curl_conncache_add_conn((data->state).conn_cache,conn);
  if (CVar17 != CURLE_OK) {
    return CVar17;
  }
  if ((((data->state).authhost.picked & 0x28) != 0) && ((data->state).authhost.done == true)) {
    Curl_infof(data,"NTLM picked AND auth done set, clear picked!\n");
    (data->state).authhost.picked = 0;
    (data->state).authhost.done = false;
  }
  local_318 = conn;
  if ((((data->state).authproxy.picked & 0x28) != 0) && ((data->state).authproxy.done == true)) {
    Curl_infof(data,"NTLM-proxy picked AND auth done set, clear picked!\n");
    (data->state).authproxy.picked = 0;
    (data->state).authproxy.done = false;
  }
  goto LAB_0011cc67;
LAB_0011b4dc:
  __s = pbVar43;
  if (*pbVar43 == 0) goto LAB_0011b52c;
  iVar16 = Curl_isalpha((uint)*pbVar43);
  if (((iVar16 == 0) && (iVar16 = Curl_isxdigit((uint)*pbVar43), iVar16 == 0)) &&
     ((bVar48 = *pbVar43, 1 < bVar48 - 0x2d && ((bVar48 != 0x7e && (bVar48 != 0x5f))))))
  goto LAB_0011b51f;
  pbVar43 = pbVar43 + 1;
  goto LAB_0011b4dc;
LAB_0011b51f:
  if (bVar48 == 0x5d) {
    *__s = 0;
    __s = __s + 1;
  }
  else {
LAB_0011b52c:
    Curl_infof(data,"Invalid IPv6 address format\n");
  }
LAB_0011b53d:
  pcVar29 = strchr((char *)__s,0x3a);
  uVar27 = 0xffffffff;
  if (pcVar29 == (char *)0x0) {
LAB_0011b5a0:
    pcVar24 = (*Curl_cstrdup)((char *)pbVar46);
    CVar17 = CURLE_OK;
    if (pcVar24 == (char *)0x0) {
      pcVar24 = (char *)0x0;
      uVar27 = 0xffffffff;
      bVar47 = false;
      CVar17 = CURLE_OUT_OF_MEMORY;
    }
    else {
      bVar47 = true;
    }
  }
  else {
    proxyuser[0] = '\0';
    proxyuser[1] = '\0';
    proxyuser[2] = '\0';
    proxyuser[3] = '\0';
    proxyuser[4] = '\0';
    proxyuser[5] = '\0';
    proxyuser[6] = '\0';
    proxyuser[7] = '\0';
    *pcVar29 = '\0';
    uVar27 = 0xffffffff;
    if (pcVar29[1] == '\0') goto LAB_0011b5a0;
    uVar27 = strtol(pcVar29 + 1,(char **)proxyuser,10);
    if (((proxyuser._0_8_ == 0) || (*(char *)proxyuser._0_8_ == '\0')) && (uVar27 < 0x10000))
    goto LAB_0011b5a0;
    pcVar24 = (char *)0x0;
    Curl_infof(data,"No valid port number in connect to host string (%s)\n",pcVar29 + 1);
    bVar47 = true;
    uVar27 = 0xffffffff;
    CVar17 = CURLE_OK;
  }
  (*Curl_cfree)(pbVar26);
  if (!bVar47) {
    return CVar17;
  }
  if (pcVar24 == (char *)0x0) {
    pcVar24 = (char *)0x0;
  }
  else if (*pcVar24 != '\0') {
    (conn->conn_to_host).rawalloc = pcVar24;
    (conn->conn_to_host).name = pcVar24;
    (conn->bits).conn_to_host = true;
    Curl_infof(data,"Connecting to hostname: %s\n",pcVar24);
    goto LAB_0011b46d;
  }
LAB_0011b456:
  (conn->bits).conn_to_host = false;
  (*Curl_cfree)(pcVar24);
  pcVar24 = (char *)0x0;
LAB_0011b46d:
  if ((int)uVar27 < 0) {
    (conn->bits).conn_to_port = false;
  }
  else {
    conn->conn_to_port = (int)uVar27;
    (conn->bits).conn_to_port = true;
    Curl_infof(data,"Connecting to port: %d\n",uVar27 & 0xffffffff);
  }
  local_318 = (connectdata *)&pcVar4->next;
  goto LAB_0011b2b9;
LAB_0011cff7:
  bVar10 = true;
LAB_0011c6d7:
  local_318->data = data;
  Curl_conncache_unlock(data);
  if (((!bVar10) && (iVar16 = IsPipeliningPossible(data,local_318), iVar16 != 0)) &&
     ((local_318->recv_pipe).size + (local_318->send_pipe).size != 0)) {
    Curl_infof(data,"Found connection %ld, with requests in the pipe (%zu)\n",
               local_318->connection_id);
    sVar34 = Curl_conncache_bundle_size(local_318);
    if ((sVar34 < sVar21) && (sVar34 = Curl_conncache_size(data), sVar34 < sVar22)) {
      bVar47 = false;
      Curl_infof(data,"We can reuse, but we want a new connection anyway\n");
      Curl_conncache_return_conn(local_318);
      goto LAB_0011cb07;
    }
  }
  (*Curl_cfree)((conn->http_proxy).host.rawalloc);
  (*Curl_cfree)((conn->socks_proxy).host.rawalloc);
  Curl_free_primary_ssl_config(dest);
  Curl_free_primary_ssl_config(dest_00);
  local_318->data = conn->data;
  _Var38 = (conn->bits).user_passwd;
  (local_318->bits).user_passwd = _Var38;
  if (_Var38 == true) {
    (*Curl_cfree)(local_318->user);
    local_318->user = (char *)0x0;
    (*Curl_cfree)(local_318->passwd);
    local_318->passwd = (char *)0x0;
    pcVar24 = conn->passwd;
    local_318->user = *ppcVar1;
    local_318->passwd = pcVar24;
    conn->user = (char *)0x0;
    conn->passwd = (char *)0x0;
  }
  _Var38 = (conn->bits).proxy_user_passwd;
  (local_318->bits).proxy_user_passwd = _Var38;
  if (_Var38 == true) {
    (*Curl_cfree)((local_318->http_proxy).user);
    (local_318->http_proxy).user = (char *)0x0;
    (*Curl_cfree)((local_318->socks_proxy).user);
    (local_318->socks_proxy).user = (char *)0x0;
    (*Curl_cfree)((local_318->http_proxy).passwd);
    (local_318->http_proxy).passwd = (char *)0x0;
    (*Curl_cfree)((local_318->socks_proxy).passwd);
    (local_318->socks_proxy).passwd = (char *)0x0;
    pcVar24 = (conn->http_proxy).passwd;
    (local_318->http_proxy).user = (conn->http_proxy).user;
    (local_318->http_proxy).passwd = pcVar24;
    pcVar24 = (conn->socks_proxy).passwd;
    (local_318->socks_proxy).user = (conn->socks_proxy).user;
    (local_318->socks_proxy).passwd = pcVar24;
    (conn->socks_proxy).user = (char *)0x0;
    (conn->socks_proxy).passwd = (char *)0x0;
    (conn->http_proxy).user = (char *)0x0;
    (conn->http_proxy).passwd = (char *)0x0;
  }
  (*Curl_cfree)((local_318->host).rawalloc);
  (local_318->host).rawalloc = (char *)0x0;
  (*Curl_cfree)((local_318->conn_to_host).rawalloc);
  (local_318->conn_to_host).rawalloc = (char *)0x0;
  pcVar24 = (conn->host).rawalloc;
  pcVar29 = (conn->host).encalloc;
  pcVar44 = (conn->host).dispname;
  (local_318->host).name = (conn->host).name;
  (local_318->host).dispname = pcVar44;
  (local_318->host).rawalloc = pcVar24;
  (local_318->host).encalloc = pcVar29;
  pcVar24 = (conn->conn_to_host).encalloc;
  pcVar29 = (conn->conn_to_host).name;
  pcVar44 = (conn->conn_to_host).dispname;
  (local_318->conn_to_host).rawalloc = (conn->conn_to_host).rawalloc;
  (local_318->conn_to_host).encalloc = pcVar24;
  (local_318->conn_to_host).name = pcVar29;
  (local_318->conn_to_host).dispname = pcVar44;
  iVar16 = conn->conn_to_port;
  local_318->remote_port = conn->remote_port;
  local_318->conn_to_port = iVar16;
  (*Curl_cfree)(local_318->hostname_resolve);
  local_318->hostname_resolve = (char *)0x0;
  local_318->hostname_resolve = conn->hostname_resolve;
  conn->hostname_resolve = (char *)0x0;
  Curl_persistconninfo(local_318);
  (local_318->bits).reuse = true;
  (*Curl_cfree)(conn->user);
  conn->user = (char *)0x0;
  (*Curl_cfree)(conn->passwd);
  conn->passwd = (char *)0x0;
  (*Curl_cfree)(conn->options);
  conn->options = (char *)0x0;
  (*Curl_cfree)((conn->http_proxy).user);
  (conn->http_proxy).user = (char *)0x0;
  (*Curl_cfree)((conn->socks_proxy).user);
  (conn->socks_proxy).user = (char *)0x0;
  (*Curl_cfree)((conn->http_proxy).passwd);
  (conn->http_proxy).passwd = (char *)0x0;
  (*Curl_cfree)((conn->socks_proxy).passwd);
  (conn->socks_proxy).passwd = (char *)0x0;
  (*Curl_cfree)(conn->localdev);
  conn->localdev = (char *)0x0;
  Curl_llist_destroy(&conn->send_pipe,(void *)0x0);
  Curl_llist_destroy(&conn->recv_pipe,(void *)0x0);
  (*Curl_cfree)(conn->master_buffer);
  conn->master_buffer = (char *)0x0;
  (*Curl_cfree)(conn->unix_domain_socket);
  conn->unix_domain_socket = (char *)0x0;
  (*Curl_cfree)(conn->ssl_extra);
  (*Curl_cfree)(conn);
  *in_connect = local_318;
  pcVar24 = "host";
  if ((local_318->bits).proxy != false) {
    pcVar24 = "proxy";
  }
  lVar30 = 0x128;
  if (((local_318->socks_proxy).host.name == (char *)0x0) &&
     (lVar30 = 0x168, (local_318->http_proxy).host.name == (char *)0x0)) {
    lVar30 = 0xd8;
  }
  Curl_infof(data,"Re-using existing connection! (#%ld) with %s %s\n",local_318->connection_id,
             pcVar24,*(undefined8 *)((local_318->chunk).hexbuffer + lVar30 + -0x20));
LAB_0011cc67:
  Curl_init_do(data,local_318);
  CVar17 = setup_range(data);
  if (CVar17 != CURLE_OK) {
    return CVar17;
  }
  local_318->seek_func = (data->set).seek_func;
  local_318->seek_client = (data->set).seek_client;
  local_304 = CURLE_OK;
  tVar31 = Curl_timeleft(data,(curltime *)0x0,true);
  if ((local_318->bits).reuse == true) {
    *async = false;
    goto LAB_0011cf63;
  }
  pcVar24 = local_318->unix_domain_socket;
  if (pcVar24 == (char *)0x0) {
    if ((local_318->bits).proxy == false) {
      lVar30 = 0xc0;
      if ((local_318->bits).conn_to_host != false) {
        lVar30 = 0xf0;
      }
      local_318->port =
           (long)*(int *)(local_318->primary_ip + (ulong)(local_318->bits).conn_to_port * 4 + -10);
      pcVar24 = (*Curl_cstrdup)(*(char **)((local_318->chunk).hexbuffer + lVar30 + -0x10));
      local_318->hostname_resolve = pcVar24;
      if (pcVar24 == (char *)0x0) goto LAB_0011ceff;
      iVar16 = Curl_resolv_timeout(local_318,pcVar24,(int)local_318->port,
                                   (Curl_dns_entry **)proxyuser,tVar31);
      if (iVar16 == -2) goto LAB_0011cf04;
      if (iVar16 == 1) goto LAB_0011ced2;
      if (proxyuser._0_8_ != 0) goto LAB_0011cf44;
      Curl_failf(data,"Couldn\'t resolve host \'%s\'",
                 *(undefined8 *)((local_318->chunk).hexbuffer + lVar30 + -8));
      local_304 = CURLE_COULDNT_RESOLVE_HOST;
    }
    else {
      uVar27 = (ulong)(((local_318->bits).socksproxy ^ 1) << 6);
      pcVar24 = (*Curl_cstrdup)(*(char **)((long)&(local_318->socks_proxy).host.name + uVar27));
      local_318->hostname_resolve = pcVar24;
      if (pcVar24 == (char *)0x0) {
LAB_0011ceff:
        local_304 = CURLE_OUT_OF_MEMORY;
        goto LAB_0011cf63;
      }
      iVar16 = Curl_resolv_timeout(local_318,pcVar24,(int)local_318->port,
                                   (Curl_dns_entry **)proxyuser,tVar31);
      if (iVar16 == -2) {
LAB_0011cf04:
        local_304 = CURLE_OPERATION_TIMEDOUT;
      }
      else {
        if (iVar16 == 1) {
LAB_0011ced2:
          *async = true;
          goto LAB_0011cf44;
        }
        if (proxyuser._0_8_ != 0) goto LAB_0011cf44;
        Curl_failf(data,"Couldn\'t resolve proxy \'%s\'",
                   *(undefined8 *)((local_318->chunk).hexbuffer + ((uVar27 | 0x110) - 8)));
        local_304 = CURLE_COULDNT_RESOLVE_PROXY;
      }
    }
  }
  else {
    puVar36 = (undefined8 *)(*Curl_ccalloc)(1,0x18);
    proxyuser._0_8_ = puVar36;
    if (puVar36 == (undefined8 *)0x0) {
      local_304 = CURLE_OUT_OF_MEMORY;
    }
    else {
      local_138[0] = false;
      pCVar37 = Curl_unix2addr(pcVar24,local_138,local_318->abstract_unix_socket);
      *puVar36 = pCVar37;
      if (pCVar37 == (Curl_addrinfo *)0x0) {
        if (local_138[0] == true) {
          Curl_failf(data,"Unix socket path too long: \'%s\'",pcVar24);
        }
        else {
          local_2a4 = CURLE_OUT_OF_MEMORY;
        }
        (*Curl_cfree)(puVar36);
        proxyuser[0] = '\0';
        proxyuser[1] = '\0';
        proxyuser[2] = '\0';
        proxyuser[3] = '\0';
        proxyuser[4] = '\0';
        proxyuser[5] = '\0';
        proxyuser[6] = '\0';
        proxyuser[7] = '\0';
        local_304 = local_2a4;
      }
      else {
        puVar36[2] = puVar36[2] + 1;
LAB_0011cf44:
        local_304 = CURLE_OK;
      }
    }
  }
  local_318->dns_entry = (Curl_dns_entry *)proxyuser._0_8_;
LAB_0011cf63:
  strip_trailing_dot(&local_318->host);
  if ((local_318->bits).httpproxy == true) {
    strip_trailing_dot(&(local_318->http_proxy).host);
  }
  if ((local_318->bits).socksproxy == true) {
    strip_trailing_dot(&(local_318->socks_proxy).host);
  }
  if ((local_318->bits).conn_to_host == true) {
    strip_trailing_dot(&local_318->conn_to_host);
  }
  return local_304;
}

Assistant:

static CURLcode create_conn(struct Curl_easy *data,
                            struct connectdata **in_connect,
                            bool *async)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn;
  struct connectdata *conn_temp = NULL;
  bool reuse;
  bool connections_available = TRUE;
  bool force_reuse = FALSE;
  bool waitpipe = FALSE;
  size_t max_host_connections = Curl_multi_max_host_connections(data->multi);
  size_t max_total_connections = Curl_multi_max_total_connections(data->multi);

  *async = FALSE;
  *in_connect = NULL;

  /*************************************************************
   * Check input data
   *************************************************************/
  if(!data->change.url) {
    result = CURLE_URL_MALFORMAT;
    goto out;
  }

  /* First, split up the current URL in parts so that we can use the
     parts for checking against the already present connections. In order
     to not have to modify everything at once, we allocate a temporary
     connection data struct and fill in for comparison purposes. */
  conn = allocate_conn(data);

  if(!conn) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }

  /* We must set the return variable as soon as possible, so that our
     parent can cleanup any possible allocs we may have done before
     any failure */
  *in_connect = conn;

  result = parseurlandfillconn(data, conn);
  if(result)
    goto out;

  if(data->set.str[STRING_BEARER]) {
    conn->oauth_bearer = strdup(data->set.str[STRING_BEARER]);
    if(!conn->oauth_bearer) {
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }
  }

#ifdef USE_UNIX_SOCKETS
  if(data->set.str[STRING_UNIX_SOCKET_PATH]) {
    conn->unix_domain_socket = strdup(data->set.str[STRING_UNIX_SOCKET_PATH]);
    if(conn->unix_domain_socket == NULL) {
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }
    conn->abstract_unix_socket = data->set.abstract_unix_socket;
  }
#endif

  /* After the unix socket init but before the proxy vars are used, parse and
     initialize the proxy vars */
#ifndef CURL_DISABLE_PROXY
  result = create_conn_helper_init_proxy(conn);
  if(result)
    goto out;
#endif

  /*************************************************************
   * If the protocol is using SSL and HTTP proxy is used, we set
   * the tunnel_proxy bit.
   *************************************************************/
  if((conn->given->flags&PROTOPT_SSL) && conn->bits.httpproxy)
    conn->bits.tunnel_proxy = TRUE;

  /*************************************************************
   * Figure out the remote port number and fix it in the URL
   *************************************************************/
  result = parse_remote_port(data, conn);
  if(result)
    goto out;

  /* Check for overridden login details and set them accordingly so they
     they are known when protocol->setup_connection is called! */
  result = override_login(data, conn, &conn->user, &conn->passwd,
                          &conn->options);
  if(result)
    goto out;

  result = set_login(conn); /* default credentials */
  if(result)
    goto out;

  /*************************************************************
   * Process the "connect to" linked list of hostname/port mappings.
   * Do this after the remote port number has been fixed in the URL.
   *************************************************************/
  result = parse_connect_to_slist(data, conn, data->set.connect_to);
  if(result)
    goto out;

  /*************************************************************
   * IDN-convert the hostnames
   *************************************************************/
  result = idnconvert_hostname(conn, &conn->host);
  if(result)
    goto out;
  if(conn->bits.conn_to_host) {
    result = idnconvert_hostname(conn, &conn->conn_to_host);
    if(result)
      goto out;
  }
  if(conn->bits.httpproxy) {
    result = idnconvert_hostname(conn, &conn->http_proxy.host);
    if(result)
      goto out;
  }
  if(conn->bits.socksproxy) {
    result = idnconvert_hostname(conn, &conn->socks_proxy.host);
    if(result)
      goto out;
  }

  /*************************************************************
   * Check whether the host and the "connect to host" are equal.
   * Do this after the hostnames have been IDN-converted.
   *************************************************************/
  if(conn->bits.conn_to_host &&
     strcasecompare(conn->conn_to_host.name, conn->host.name)) {
    conn->bits.conn_to_host = FALSE;
  }

  /*************************************************************
   * Check whether the port and the "connect to port" are equal.
   * Do this after the remote port number has been fixed in the URL.
   *************************************************************/
  if(conn->bits.conn_to_port && conn->conn_to_port == conn->remote_port) {
    conn->bits.conn_to_port = FALSE;
  }

  /*************************************************************
   * If the "connect to" feature is used with an HTTP proxy,
   * we set the tunnel_proxy bit.
   *************************************************************/
  if((conn->bits.conn_to_host || conn->bits.conn_to_port) &&
      conn->bits.httpproxy)
    conn->bits.tunnel_proxy = TRUE;

  /*************************************************************
   * Setup internals depending on protocol. Needs to be done after
   * we figured out what/if proxy to use.
   *************************************************************/
  result = setup_connection_internals(conn);
  if(result)
    goto out;

  conn->recv[FIRSTSOCKET] = Curl_recv_plain;
  conn->send[FIRSTSOCKET] = Curl_send_plain;
  conn->recv[SECONDARYSOCKET] = Curl_recv_plain;
  conn->send[SECONDARYSOCKET] = Curl_send_plain;

  conn->bits.tcp_fastopen = data->set.tcp_fastopen;

  /***********************************************************************
   * file: is a special case in that it doesn't need a network connection
   ***********************************************************************/
#ifndef CURL_DISABLE_FILE
  if(conn->handler->flags & PROTOPT_NONETWORK) {
    bool done;
    /* this is supposed to be the connect function so we better at least check
       that the file is present here! */
    DEBUGASSERT(conn->handler->connect_it);
    Curl_persistconninfo(conn);
    result = conn->handler->connect_it(conn, &done);

    /* Setup a "faked" transfer that'll do nothing */
    if(!result) {
      conn->bits.tcpconnect[FIRSTSOCKET] = TRUE; /* we are "connected */

      result = Curl_conncache_add_conn(data->state.conn_cache, conn);
      if(result)
        goto out;

      /*
       * Setup whatever necessary for a resumed transfer
       */
      result = setup_range(data);
      if(result) {
        DEBUGASSERT(conn->handler->done);
        /* we ignore the return code for the protocol-specific DONE */
        (void)conn->handler->done(conn, result, FALSE);
        goto out;
      }

      Curl_setup_transfer(conn, -1, -1, FALSE, NULL, /* no download */
                          -1, NULL); /* no upload */
    }

    /* since we skip do_init() */
    Curl_init_do(data, conn);

    goto out;
  }
#endif

  /* Get a cloned copy of the SSL config situation stored in the
     connection struct. But to get this going nicely, we must first make
     sure that the strings in the master copy are pointing to the correct
     strings in the session handle strings array!

     Keep in mind that the pointers in the master copy are pointing to strings
     that will be freed as part of the Curl_easy struct, but all cloned
     copies will be separately allocated.
  */
  data->set.ssl.primary.CApath = data->set.str[STRING_SSL_CAPATH_ORIG];
  data->set.proxy_ssl.primary.CApath = data->set.str[STRING_SSL_CAPATH_PROXY];
  data->set.ssl.primary.CAfile = data->set.str[STRING_SSL_CAFILE_ORIG];
  data->set.proxy_ssl.primary.CAfile = data->set.str[STRING_SSL_CAFILE_PROXY];
  data->set.ssl.primary.random_file = data->set.str[STRING_SSL_RANDOM_FILE];
  data->set.proxy_ssl.primary.random_file =
    data->set.str[STRING_SSL_RANDOM_FILE];
  data->set.ssl.primary.egdsocket = data->set.str[STRING_SSL_EGDSOCKET];
  data->set.proxy_ssl.primary.egdsocket = data->set.str[STRING_SSL_EGDSOCKET];
  data->set.ssl.primary.cipher_list =
    data->set.str[STRING_SSL_CIPHER_LIST_ORIG];
  data->set.proxy_ssl.primary.cipher_list =
    data->set.str[STRING_SSL_CIPHER_LIST_PROXY];
  data->set.ssl.primary.cipher_list13 =
    data->set.str[STRING_SSL_CIPHER13_LIST_ORIG];
  data->set.proxy_ssl.primary.cipher_list13 =
    data->set.str[STRING_SSL_CIPHER13_LIST_PROXY];

  data->set.ssl.CRLfile = data->set.str[STRING_SSL_CRLFILE_ORIG];
  data->set.proxy_ssl.CRLfile = data->set.str[STRING_SSL_CRLFILE_PROXY];
  data->set.ssl.issuercert = data->set.str[STRING_SSL_ISSUERCERT_ORIG];
  data->set.proxy_ssl.issuercert = data->set.str[STRING_SSL_ISSUERCERT_PROXY];
  data->set.ssl.cert = data->set.str[STRING_CERT_ORIG];
  data->set.proxy_ssl.cert = data->set.str[STRING_CERT_PROXY];
  data->set.ssl.cert_type = data->set.str[STRING_CERT_TYPE_ORIG];
  data->set.proxy_ssl.cert_type = data->set.str[STRING_CERT_TYPE_PROXY];
  data->set.ssl.key = data->set.str[STRING_KEY_ORIG];
  data->set.proxy_ssl.key = data->set.str[STRING_KEY_PROXY];
  data->set.ssl.key_type = data->set.str[STRING_KEY_TYPE_ORIG];
  data->set.proxy_ssl.key_type = data->set.str[STRING_KEY_TYPE_PROXY];
  data->set.ssl.key_passwd = data->set.str[STRING_KEY_PASSWD_ORIG];
  data->set.proxy_ssl.key_passwd = data->set.str[STRING_KEY_PASSWD_PROXY];
  data->set.ssl.primary.clientcert = data->set.str[STRING_CERT_ORIG];
  data->set.proxy_ssl.primary.clientcert = data->set.str[STRING_CERT_PROXY];
#ifdef USE_TLS_SRP
  data->set.ssl.username = data->set.str[STRING_TLSAUTH_USERNAME_ORIG];
  data->set.proxy_ssl.username = data->set.str[STRING_TLSAUTH_USERNAME_PROXY];
  data->set.ssl.password = data->set.str[STRING_TLSAUTH_PASSWORD_ORIG];
  data->set.proxy_ssl.password = data->set.str[STRING_TLSAUTH_PASSWORD_PROXY];
#endif

  if(!Curl_clone_primary_ssl_config(&data->set.ssl.primary,
     &conn->ssl_config)) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }

  if(!Curl_clone_primary_ssl_config(&data->set.proxy_ssl.primary,
                                    &conn->proxy_ssl_config)) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }

  prune_dead_connections(data);

  /*************************************************************
   * Check the current list of connections to see if we can
   * re-use an already existing one or if we have to create a
   * new one.
   *************************************************************/

  DEBUGASSERT(conn->user);
  DEBUGASSERT(conn->passwd);

  /* reuse_fresh is TRUE if we are told to use a new connection by force, but
     we only acknowledge this option if this is not a re-used connection
     already (which happens due to follow-location or during a HTTP
     authentication phase). */
  if(data->set.reuse_fresh && !data->state.this_is_a_follow)
    reuse = FALSE;
  else
    reuse = ConnectionExists(data, conn, &conn_temp, &force_reuse, &waitpipe);

  /* If we found a reusable connection that is now marked as in use, we may
     still want to open a new connection if we are pipelining. */
  if(reuse && !force_reuse && IsPipeliningPossible(data, conn_temp)) {
    size_t pipelen = conn_temp->send_pipe.size + conn_temp->recv_pipe.size;
    if(pipelen > 0) {
      infof(data, "Found connection %ld, with requests in the pipe (%zu)\n",
            conn_temp->connection_id, pipelen);

      if(Curl_conncache_bundle_size(conn_temp) < max_host_connections &&
         Curl_conncache_size(data) < max_total_connections) {
        /* We want a new connection anyway */
        reuse = FALSE;

        infof(data, "We can reuse, but we want a new connection anyway\n");
        Curl_conncache_return_conn(conn_temp);
      }
    }
  }

  if(reuse) {
    /*
     * We already have a connection for this, we got the former connection
     * in the conn_temp variable and thus we need to cleanup the one we
     * just allocated before we can move along and use the previously
     * existing one.
     */
    reuse_conn(conn, conn_temp);
#ifdef USE_SSL
    free(conn->ssl_extra);
#endif
    free(conn);          /* we don't need this anymore */
    conn = conn_temp;
    *in_connect = conn;

    infof(data, "Re-using existing connection! (#%ld) with %s %s\n",
          conn->connection_id,
          conn->bits.proxy?"proxy":"host",
          conn->socks_proxy.host.name ? conn->socks_proxy.host.dispname :
          conn->http_proxy.host.name ? conn->http_proxy.host.dispname :
                                       conn->host.dispname);
  }
  else {
    /* We have decided that we want a new connection. However, we may not
       be able to do that if we have reached the limit of how many
       connections we are allowed to open. */

    if(conn->handler->flags & PROTOPT_ALPN_NPN) {
      /* The protocol wants it, so set the bits if enabled in the easy handle
         (default) */
      if(data->set.ssl_enable_alpn)
        conn->bits.tls_enable_alpn = TRUE;
      if(data->set.ssl_enable_npn)
        conn->bits.tls_enable_npn = TRUE;
    }

    if(waitpipe)
      /* There is a connection that *might* become usable for pipelining
         "soon", and we wait for that */
      connections_available = FALSE;
    else {
      /* this gets a lock on the conncache */
      struct connectbundle *bundle =
        Curl_conncache_find_bundle(conn, data->state.conn_cache);

      if(max_host_connections > 0 && bundle &&
         (bundle->num_connections >= max_host_connections)) {
        struct connectdata *conn_candidate;

        /* The bundle is full. Extract the oldest connection. */
        conn_candidate = Curl_conncache_extract_bundle(data, bundle);
        Curl_conncache_unlock(data);

        if(conn_candidate)
          (void)Curl_disconnect(data, conn_candidate,
                                /* dead_connection */ FALSE);
        else {
          infof(data, "No more connections allowed to host: %zu\n",
                max_host_connections);
          connections_available = FALSE;
        }
      }
      else
        Curl_conncache_unlock(data);

    }

    if(connections_available &&
       (max_total_connections > 0) &&
       (Curl_conncache_size(data) >= max_total_connections)) {
      struct connectdata *conn_candidate;

      /* The cache is full. Let's see if we can kill a connection. */
      conn_candidate = Curl_conncache_extract_oldest(data);
      if(conn_candidate)
        (void)Curl_disconnect(data, conn_candidate,
                              /* dead_connection */ FALSE);
      else {
        infof(data, "No connections available in cache\n");
        connections_available = FALSE;
      }
    }

    if(!connections_available) {
      infof(data, "No connections available.\n");

      conn_free(conn);
      *in_connect = NULL;

      result = CURLE_NO_CONNECTION_AVAILABLE;
      goto out;
    }
    else {
      /*
       * This is a brand new connection, so let's store it in the connection
       * cache of ours!
       */
      result = Curl_conncache_add_conn(data->state.conn_cache, conn);
      if(result)
        goto out;
    }

#if defined(USE_NTLM)
    /* If NTLM is requested in a part of this connection, make sure we don't
       assume the state is fine as this is a fresh connection and NTLM is
       connection based. */
    if((data->state.authhost.picked & (CURLAUTH_NTLM | CURLAUTH_NTLM_WB)) &&
       data->state.authhost.done) {
      infof(data, "NTLM picked AND auth done set, clear picked!\n");
      data->state.authhost.picked = CURLAUTH_NONE;
      data->state.authhost.done = FALSE;
    }

    if((data->state.authproxy.picked & (CURLAUTH_NTLM | CURLAUTH_NTLM_WB)) &&
       data->state.authproxy.done) {
      infof(data, "NTLM-proxy picked AND auth done set, clear picked!\n");
      data->state.authproxy.picked = CURLAUTH_NONE;
      data->state.authproxy.done = FALSE;
    }
#endif
  }

  /* Setup and init stuff before DO starts, in preparing for the transfer. */
  Curl_init_do(data, conn);

  /*
   * Setup whatever necessary for a resumed transfer
   */
  result = setup_range(data);
  if(result)
    goto out;

  /* Continue connectdata initialization here. */

  /*
   * Inherit the proper values from the urldata struct AFTER we have arranged
   * the persistent connection stuff
   */
  conn->seek_func = data->set.seek_func;
  conn->seek_client = data->set.seek_client;

  /*************************************************************
   * Resolve the address of the server or proxy
   *************************************************************/
  result = resolve_server(data, conn, async);

  /* Strip trailing dots. resolve_server copied the name. */
  strip_trailing_dot(&conn->host);
  if(conn->bits.httpproxy)
    strip_trailing_dot(&conn->http_proxy.host);
  if(conn->bits.socksproxy)
    strip_trailing_dot(&conn->socks_proxy.host);
  if(conn->bits.conn_to_host)
    strip_trailing_dot(&conn->conn_to_host);

out:
  return result;
}